

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O0

ostringstream *
tinyusdz::fmt::detail::format_sv_rec<std::__cxx11::string,long,std::__cxx11::string>
          (ostringstream *ss,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sv,size_t idx,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
          long *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  long *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_local;
  size_t idx_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sv_local;
  ostringstream *ss_local;
  
  sVar2 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(sv);
  if (idx < sVar2) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)sv,idx);
    bVar1 = ::std::operator==(pvVar3,"{}");
    if (bVar1) {
      ::std::operator<<((ostream *)ss,(string *)v);
      format_sv_rec<long,std::__cxx11::string>(ss,sv,idx + 1,args,args_1);
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)sv,idx);
      ::std::operator<<((ostream *)ss,(string *)pvVar3);
      format_sv_rec<std::__cxx11::string,long,std::__cxx11::string>(ss,sv,idx + 1,v,args,args_1);
    }
  }
  return ss;
}

Assistant:

std::ostringstream &format_sv_rec(std::ostringstream &ss,
                                  const std::vector<std::string> &sv,
                                  size_t idx, T const &v, Rest const &...args) {
  if (idx >= sv.size()) {
    return ss;
  }

  if (sv[idx] == "{}") {
    ss << v;
    format_sv_rec(ss, sv, idx + 1, args...);
  } else {
    ss << sv[idx];
    format_sv_rec(ss, sv, idx + 1, v, args...);
  }

  return ss;
}